

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O1

void __thiscall
vkt::texture::SampleVerifier::fetchTexel
          (SampleVerifier *this,IVec3 *coordIn,int layer,int level,VkFilter filter,Vec4 *resultMin,
          Vec4 *resultMax)

{
  ImgDim IVar1;
  VkBorderColor VVar2;
  SamplerParameters *pSVar3;
  pointer pCVar4;
  bool bVar5;
  int i;
  deInt32 dVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  bool bVar10;
  int faceNdx;
  int ndx;
  bool bVar11;
  Vec4 *coord_00;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  IVec3 coord;
  VkSamplerAddressMode wrappingModes [3];
  IVec2 newCoord;
  IVec2 IStack_b0;
  IVec2 local_a8 [2];
  undefined1 local_94 [16];
  int faces [3];
  int newFace;
  Vec4 cornerTexels [3];
  
  coord.m_data[2] = coordIn->m_data[2];
  coord.m_data._0_8_ = *(undefined8 *)coordIn->m_data;
  pSVar3 = this->m_samplerParams;
  wrappingModes[0] = pSVar3->wrappingModeU;
  wrappingModes[1] = pSVar3->wrappingModeV;
  wrappingModes[2] = pSVar3->wrappingModeW;
  bVar5 = ::vk::isSrgbFormat(this->m_imParams->format);
  IVar1 = this->m_imParams->dim;
  if (filter == VK_FILTER_LINEAR && IVar1 == IMG_DIM_CUBE) {
    bVar10 = true;
    bVar11 = true;
    if (-1 < coord.m_data[0]) {
      bVar11 = (this->m_levels->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[0] <= coord.m_data[0]
      ;
    }
    if (-1 < (long)coord.m_data._0_8_) {
      bVar10 = (this->m_levels->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[1] <= coord.m_data[1]
      ;
    }
    faceNdx = layer % 6;
    if (bVar11 == bVar10) {
      if (((coord.m_data[0] < 0) ||
          ((this->m_levels->
           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[0] <= coord.m_data[0]))
         && (((long)coord.m_data._0_8_ < 0 ||
             ((this->m_levels->
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[1] <= coord.m_data[1])
             ))) {
        lVar7 = 0;
        faces[1] = 0;
        faces[2] = 0;
        local_a8[0].m_data[0] = 0;
        local_a8[0].m_data[1] = 0;
        newCoord.m_data[0] = 0;
        newCoord.m_data[1] = 0;
        IStack_b0.m_data[0] = 0;
        IStack_b0.m_data[1] = 0;
        coord_00 = cornerTexels;
        cornerTexels[0].m_data[0] = (float)coord.m_data[0];
        cornerTexels[0].m_data[1] = (float)coord.m_data[1];
        pCVar4 = (this->m_levels->
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start + level;
        local_94._0_4_ = (pCVar4->m_size).m_data[0];
        local_94._4_4_ = (pCVar4->m_size).m_data[1];
        faces[0] = faceNdx;
        util::wrapCubemapCorner
                  ((IVec2 *)coord_00,(IVec2 *)local_94,faceNdx,faces + 1,faces + 2,&newCoord,
                   &IStack_b0,local_a8);
        cornerTexels[2].m_data[0] = 0.0;
        cornerTexels[2].m_data[1] = 0.0;
        cornerTexels[2].m_data[2] = 0.0;
        cornerTexels[2].m_data[3] = 0.0;
        cornerTexels[1].m_data[0] = 0.0;
        cornerTexels[1].m_data[1] = 0.0;
        cornerTexels[1].m_data[2] = 0.0;
        cornerTexels[1].m_data[3] = 0.0;
        cornerTexels[0].m_data[0] = 0.0;
        cornerTexels[0].m_data[1] = 0.0;
        cornerTexels[0].m_data[2] = 0.0;
        cornerTexels[0].m_data[3] = 0.0;
        do {
          if (bVar5) {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&newFace,
                       (int)(this->m_levels->
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            )._M_impl.super__Vector_impl_data._M_start + level * 0x28,
                       (&newCoord)[lVar7].m_data[0],(&newCoord)[lVar7].m_data[1]);
            tcu::sRGBToLinear((tcu *)local_94,(Vec4 *)&newFace);
            lVar8 = 0;
            do {
              coord_00->m_data[lVar8] = (float)faces[lVar8 + -4] + coord_00->m_data[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
          }
          else {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_94,
                       (int)(this->m_levels->
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            )._M_impl.super__Vector_impl_data._M_start + level * 0x28,
                       (&newCoord)[lVar7].m_data[0],(&newCoord)[lVar7].m_data[1]);
            lVar8 = 0;
            do {
              coord_00->m_data[lVar8] = (float)faces[lVar8 + -4] + coord_00->m_data[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
          }
          lVar7 = lVar7 + 1;
          coord_00 = coord_00 + 1;
        } while (lVar7 != 3);
        pfVar9 = cornerTexels[1].m_data;
        lVar7 = 0;
        do {
          fVar12 = cornerTexels[0].m_data[lVar7];
          lVar8 = 0;
          fVar13 = fVar12;
          do {
            fVar14 = *(float *)((long)pfVar9 + lVar8);
            fVar12 = (float)(~-(uint)(fVar14 <= fVar12) & (uint)fVar12 |
                            -(uint)(fVar14 <= fVar12) & (uint)fVar14);
            fVar13 = (float)(~-(uint)(fVar13 <= fVar14) & (uint)fVar13 |
                            (uint)fVar14 & -(uint)(fVar13 <= fVar14));
            lVar8 = lVar8 + 0x10;
          } while (lVar8 != 0x20);
          resultMin->m_data[lVar7] = fVar12;
          resultMax->m_data[lVar7] = fVar13;
          lVar7 = lVar7 + 1;
          pfVar9 = pfVar9 + 1;
        } while (lVar7 != 4);
        bVar5 = false;
      }
      else {
        bVar5 = true;
      }
    }
    else {
      newCoord.m_data[0] = 0;
      newCoord.m_data[1] = 0;
      newFace = 0;
      cornerTexels[0].m_data[0] = (float)coord.m_data[0];
      cornerTexels[0].m_data[1] = (float)coord.m_data[1];
      pCVar4 = (this->m_levels->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start + level;
      local_94._0_4_ = (pCVar4->m_size).m_data[0];
      local_94._4_4_ = (pCVar4->m_size).m_data[1];
      util::wrapCubemapEdge((IVec2 *)cornerTexels,(IVec2 *)local_94,faceNdx,&newCoord,&newFace);
      cornerTexels[0].m_data._0_8_ = &coord;
      cornerTexels[0].m_data[2] = 0.0;
      cornerTexels[0].m_data[3] = 1.4013e-45;
      lVar7 = 0;
      do {
        coord.m_data[(int)cornerTexels[0].m_data[lVar7 + 2]] = newCoord.m_data[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
      layer = (layer / 6) * 6 + newFace;
      bVar5 = true;
    }
    if (!bVar5) {
      return;
    }
  }
  else {
    if (IVar1 == IMG_DIM_CUBE) {
      wrappingModes[2] = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
      wrappingModes[0] = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
      wrappingModes[1] = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
    }
    lVar7 = 0;
    do {
      dVar6 = util::wrapTexelCoord
                        (coord.m_data[lVar7],
                         (this->m_levels->
                         super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[lVar7],
                         wrappingModes[lVar7]);
      coord.m_data[lVar7] = dVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  if (((((coord.m_data[0] < 0) ||
        ((this->m_levels->
         super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
         )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[0] <= coord.m_data[0])) ||
       ((long)coord.m_data._0_8_ < 0)) ||
      (((this->m_levels->
        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
        )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[1] <= coord.m_data[1] ||
       (coord.m_data[2] < 0)))) ||
     ((this->m_levels->
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>)
      ._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[2] <= coord.m_data[2])) {
    VVar2 = this->m_samplerParams->borderColor;
    if (VVar2 == VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE) {
      fVar12 = 1.0;
      fVar13 = 1.0;
      fVar14 = 1.0;
      fVar15 = 1.0;
    }
    else if (VVar2 == VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK) {
      fVar12 = 0.0;
      fVar13 = 0.0;
      fVar14 = 0.0;
      fVar15 = 1.0;
    }
    else {
      if (VVar2 != VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK) {
        return;
      }
      fVar12 = 0.0;
      fVar13 = 0.0;
      fVar14 = 0.0;
      fVar15 = 0.0;
    }
    resultMin->m_data[0] = fVar12;
    resultMin->m_data[1] = fVar13;
    resultMin->m_data[2] = fVar14;
    resultMin->m_data[3] = fVar15;
    resultMax->m_data[0] = fVar12;
    resultMax->m_data[1] = fVar13;
    resultMax->m_data[2] = fVar14;
    resultMax->m_data[3] = fVar15;
  }
  else {
    fetchTexelWrapped(this,&coord,layer,level,resultMin,resultMax);
  }
  return;
}

Assistant:

void SampleVerifier::fetchTexel (const IVec3&	coordIn,
								 int			layer,
								 int			level,
								 VkFilter		filter,
								 Vec4&			resultMin,
								 Vec4&			resultMax) const
{
	IVec3 coord = coordIn;

	VkSamplerAddressMode wrappingModes[] =
	{
		m_samplerParams.wrappingModeU,
		m_samplerParams.wrappingModeV,
		m_samplerParams.wrappingModeW
	};

	const bool isSrgb = isSrgbFormat(m_imParams.format);

	// Wrapping operations


	if (m_imParams.dim == IMG_DIM_CUBE && filter == VK_FILTER_LINEAR)
	{
		// If the image is a cubemap and we are using linear filtering, we do edge or corner wrapping

		const int	arrayLayer = layer / 6;
		int			arrayFace  = layer % 6;

		if (coordOutOfRange(coord, 0, level) != coordOutOfRange(coord, 1, level))
		{
			// Wrap around edge

			IVec2	newCoord(0);
			int		newFace = 0;

			wrapCubemapEdge(coord.swizzle(0, 1),
							m_levels[level].getSize().swizzle(0, 1),
							arrayFace,
							newCoord,
							newFace);

			coord.xy()	= newCoord;
			layer		= arrayLayer * 6 + newFace;
		}
		else if (coordOutOfRange(coord, 0, level) && coordOutOfRange(coord, 1, level))
		{
			// Wrap corner

			int   faces[3] = {arrayFace, 0, 0};
			IVec2 cornerCoords[3];

			wrapCubemapCorner(coord.swizzle(0, 1),
							  m_levels[level].getSize().swizzle(0, 1),
							  arrayFace,
							  faces[1],
							  faces[2],
							  cornerCoords[0],
							  cornerCoords[1],
							  cornerCoords[2]);

			// \todo [2016-08-01 collinbaker] Call into fetchTexelWrapped instead

			Vec4 cornerTexels[3];

			for (int ndx = 0; ndx < 3; ++ndx)
			{
				int cornerLayer = faces[ndx] + arrayLayer * 6;

				if (isSrgb)
				{
				    cornerTexels[ndx] += sRGBToLinear(m_levels[level].getPixel(cornerCoords[ndx][0], cornerCoords[ndx][1], cornerLayer));
				}
				else
				{
					cornerTexels[ndx] += m_levels[level].getPixel(cornerCoords[ndx][0], cornerCoords[ndx][1], cornerLayer);
				}
			}

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				float compMin = cornerTexels[0][compNdx];
				float compMax = cornerTexels[0][compNdx];

				for (int ndx = 1; ndx < 3; ++ndx)
				{
					const float comp = cornerTexels[ndx][compNdx];

					compMin = de::min(comp, compMin);
					compMax = de::max(comp, compMax);
				}

				resultMin[compNdx] = compMin;
				resultMax[compNdx] = compMax;
			}

			return;
		}
		else
		{
			// If no wrapping is necessary, just do nothing
		}
	}
	else
	{
		// Otherwise, we do normal wrapping

		if (m_imParams.dim == IMG_DIM_CUBE)
		{
			wrappingModes[0] = wrappingModes[1] = wrappingModes[2] = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
		}

		for (int compNdx = 0; compNdx < 3; ++compNdx)
		{
			const int size = m_levels[level].getSize()[compNdx];

			coord[compNdx] = wrapTexelCoord(coord[compNdx], size, wrappingModes[compNdx]);
		}
	}

	if (coordOutOfRange(coord, 0, level) ||
		coordOutOfRange(coord, 1, level) ||
		coordOutOfRange(coord, 2, level))
	{
		// If after wrapping coordinates are still out of range, perform texel replacement

		switch (m_samplerParams.borderColor)
		{
			case VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK:
			{
				resultMin = Vec4(0.0f, 0.0f, 0.0f, 0.0f);
				resultMax = Vec4(0.0f, 0.0f, 0.0f, 0.0f);
				return;
			}
			case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
			{
				resultMin = Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				resultMax = Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				return;
			}
			case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
			{
				resultMin = Vec4(1.0f, 1.0f, 1.0f, 1.0f);
				resultMax = Vec4(1.0f, 1.0f, 1.0f, 1.0f);
				return;
			}
			default:
			{
				// \\ [2016-07-07 collinbaker] Handle
				// VK_BORDER_COLOR_INT_* borders
				DE_FATAL("Not implemented");
				break;
			}
		}
	}
	else
	{
		// Otherwise, actually fetch a texel

	    fetchTexelWrapped(coord, layer, level, resultMin, resultMax);
	}
}